

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

optional<pbrt::BSDFSample> * __thiscall
pbrt::DiffuseBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DiffuseBxDF *this,Vector3f wo,Float uc
          ,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i;
  long lVar9;
  undefined8 uVar10;
  float fVar11;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar16 [16];
  float fVar17;
  ulong in_XMM0_Qb;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar22 [56];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar27 [56];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_register_000012c8 [56];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wi;
  Vector3f wi_00;
  SampledSpectrum SVar30;
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  auVar24._4_60_ = wo._12_60_;
  auVar24._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23 = auVar24._0_16_;
  auVar18 = ZEXT464((uint)(this->R).values.values[0]);
  lVar9 = 1;
  do {
    auVar15 = vmaxss_avx(ZEXT416((uint)(this->R).values.values[lVar9]),auVar18._0_16_);
    auVar18 = ZEXT1664(auVar15);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  auVar18 = ZEXT464((uint)(this->T).values.values[0]);
  lVar9 = 5;
  do {
    auVar14 = vmaxss_avx(ZEXT416((uint)(this->R).values.values[lVar9]),auVar18._0_16_);
    auVar18 = ZEXT1664(auVar14);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  fVar13 = (float)((uint)((byte)sampleFlags & 1) * auVar15._0_4_);
  fVar11 = (float)((uint)((sampleFlags & Transmission) != Unset) * auVar14._0_4_);
  if (((fVar13 != 0.0) || (fVar11 != 0.0)) || (NAN(fVar11))) {
    fVar1 = fVar13 + fVar11;
    auVar14._0_4_ = u.super_Tuple2<pbrt::Point2,_float>.x + u.super_Tuple2<pbrt::Point2,_float>.x;
    auVar14._4_4_ = u.super_Tuple2<pbrt::Point2,_float>.y + u.super_Tuple2<pbrt::Point2,_float>.y;
    auVar14._8_4_ = in_register_000012c8._0_4_ + in_register_000012c8._0_4_;
    auVar14._12_4_ = in_register_000012c8._4_4_ + in_register_000012c8._4_4_;
    auVar15._8_4_ = 0xbf800000;
    auVar15._0_8_ = 0xbf800000bf800000;
    auVar15._12_4_ = 0xbf800000;
    auVar14 = vaddps_avx512vl(auVar14,auVar15);
    auVar15 = vmovshdup_avx(auVar14);
    uVar2 = vcmpps_avx512vl(auVar14,ZEXT816(0),0);
    uVar3 = vcmpps_avx512vl(auVar15,ZEXT816(0),0);
    auVar18 = ZEXT1264(ZEXT812(0));
    fVar17 = auVar14._0_4_;
    fVar12 = auVar15._0_4_;
    if (fVar13 / fVar1 <= uc) {
      if ((uVar2 & uVar3 & 1) == 0) {
        auVar23._8_4_ = 0x7fffffff;
        auVar23._0_8_ = 0x7fffffff7fffffff;
        auVar23._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar23);
        auVar23 = vshufps_avx(auVar15,auVar15,0xf5);
        bVar4 = auVar23._0_4_ < auVar15._0_4_;
        auVar29._0_4_ = fVar17 / fVar12;
        auVar29._4_12_ = auVar14._4_12_;
        auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar29,ZEXT416(0x3fc90fdb));
        fVar13 = (float)((uint)bVar4 * (int)((fVar12 / fVar17) * 0.7853982) +
                        (uint)!bVar4 * auVar23._0_4_);
        fVar12 = (float)((uint)bVar4 * (int)fVar17 + (uint)!bVar4 * (int)fVar12);
        fVar17 = cosf(fVar13);
        fVar13 = sinf(fVar13);
        auVar23 = ZEXT416((uint)auVar24._0_4_);
        auVar15 = vinsertps_avx(ZEXT416((uint)(fVar12 * fVar17)),ZEXT416((uint)(fVar12 * fVar13)),
                                0x10);
        auVar18 = ZEXT1664(auVar15);
      }
      auVar29 = auVar18._0_16_;
      auVar14 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar29,auVar29);
      auVar15 = vmovshdup_avx(auVar29);
      auVar15 = vfnmadd213ss_fma(auVar15,auVar15,auVar14);
      auVar14 = ZEXT816(0) << 0x40;
      auVar15 = vmaxss_avx(auVar15,auVar14);
      if (auVar15._0_4_ < 0.0) {
        auVar21._0_4_ = sqrtf(auVar15._0_4_);
        auVar21._4_60_ = extraout_var_00;
        auVar14 = ZEXT816(0) << 0x40;
        auVar18 = ZEXT1664(auVar29);
        auVar23 = ZEXT416((uint)auVar24._0_4_);
        auVar15 = auVar21._0_16_;
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
      }
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar16 = vxorps_avx512vl(auVar15,auVar16);
      uVar10 = vcmpss_avx512f(auVar14,auVar23,1);
      bVar4 = (bool)((byte)uVar10 & 1);
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(auVar15,auVar8);
      fVar13 = (float)((uint)bVar4 * auVar16._0_4_ + (uint)!bVar4 * auVar15._0_4_);
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      auVar27 = ZEXT856(auVar23._8_8_);
      auVar22 = ZEXT856(in_XMM0_Qb);
      wi_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar18._0_8_;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar13;
      SVar30 = f(this,wo_01,wi_00,mode);
      auVar26._0_8_ = SVar30.values.values._8_8_;
      auVar26._8_56_ = auVar27;
      auVar18._0_8_ = SVar30.values.values._0_8_;
      auVar18._8_56_ = auVar22;
      __return_storage_ptr__->set = true;
      auVar23 = vmovlhps_avx(auVar18._0_16_,auVar26._0_16_);
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar23;
      uVar10 = vmovlps_avx(auVar29);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar10;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar13;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (fVar11 * auVar14._0_4_ * 0.31830987) / fVar1;
      uVar10 = 0x3f80000000000006;
    }
    else {
      if ((uVar2 & uVar3 & 1) == 0) {
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar5);
        auVar23 = vshufps_avx(auVar15,auVar15,0xf5);
        bVar4 = auVar23._0_4_ < auVar15._0_4_;
        auVar28._0_4_ = fVar17 / fVar12;
        auVar28._4_12_ = auVar14._4_12_;
        auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar28,ZEXT416(0x3fc90fdb));
        fVar11 = (float)((uint)bVar4 * (int)((fVar12 / fVar17) * 0.7853982) +
                        (uint)!bVar4 * auVar23._0_4_);
        fVar12 = (float)((uint)bVar4 * (int)fVar17 + (uint)!bVar4 * (int)fVar12);
        fVar17 = cosf(fVar11);
        fVar11 = sinf(fVar11);
        auVar23 = ZEXT416((uint)auVar24._0_4_);
        auVar15 = vinsertps_avx(ZEXT416((uint)(fVar12 * fVar17)),ZEXT416((uint)(fVar12 * fVar11)),
                                0x10);
        auVar18 = ZEXT1664(auVar15);
      }
      auVar29 = auVar18._0_16_;
      auVar14 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar29,auVar29);
      auVar15 = vmovshdup_avx(auVar29);
      auVar15 = vfnmadd213ss_fma(auVar15,auVar15,auVar14);
      auVar14 = ZEXT816(0) << 0x40;
      auVar15 = vmaxss_avx(auVar15,auVar14);
      if (auVar15._0_4_ < 0.0) {
        auVar19._0_4_ = sqrtf(auVar15._0_4_);
        auVar19._4_60_ = extraout_var;
        auVar14 = ZEXT816(0) << 0x40;
        auVar18 = ZEXT1664(auVar29);
        auVar23 = ZEXT416((uint)auVar24._0_4_);
        auVar15 = auVar19._0_16_;
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
      }
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar16 = vxorps_avx512vl(auVar15,auVar6);
      uVar10 = vcmpss_avx512f(auVar23,auVar14,1);
      bVar4 = (bool)((byte)uVar10 & 1);
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(auVar15,auVar7);
      fVar11 = (float)((uint)bVar4 * auVar16._0_4_ + (uint)!bVar4 * auVar15._0_4_);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
      auVar27 = ZEXT856(auVar23._8_8_);
      auVar22 = ZEXT856(in_XMM0_Qb);
      wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar18._0_8_;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
      SVar30 = f(this,wo_00,wi,mode);
      auVar25._0_8_ = SVar30.values.values._8_8_;
      auVar25._8_56_ = auVar27;
      auVar20._0_8_ = SVar30.values.values._0_8_;
      auVar20._8_56_ = auVar22;
      __return_storage_ptr__->set = true;
      auVar23 = vmovlhps_avx(auVar20._0_16_,auVar25._0_16_);
      *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar23;
      uVar10 = vmovlps_avx(auVar29);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar10;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar11;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
           (fVar13 * auVar14._0_4_ * 0.31830987) / fVar1;
      uVar10 = 0x3f80000000000005;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar10;
    (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  }
  else {
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x10) = ZEXT432(0) << 0x40
    ;
    *(undefined1 (*) [32])&__return_storage_ptr__->optionalValue = ZEXT432(0) << 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f wo, Float uc, Point2f u, TransportMode mode,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        // Compute reflection and transmission probabilities for diffuse BSDF
        Float pr = R.MaxComponentValue(), pt = T.MaxComponentValue();
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        // Randomly sample diffuse BSDF reflection or transmission
        if (uc < pr / (pr + pt)) {
            // Sample diffuse BSDF reflection
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z < 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pr / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseReflection);

        } else {
            // Sample diffuse BSDF transmission
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z > 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pt / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseTransmission);
        }
    }